

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPPacket::BuildPacket
          (RTPPacket *this,uint8_t payloadtype,void *payloaddata,size_t payloadlen,uint16_t seqnr,
          uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,uint32_t *csrcs,
          bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,void *extensiondata,
          void *buffer,size_t maxsize)

{
  size_t numbytes;
  ushort *puVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  RTPMemoryManager *mgr;
  uint8_t *puVar5;
  RTPExtensionHeader *rtpexthdr;
  uint32_t *puStack_50;
  int i;
  uint32_t *curcsrc;
  RTPHeader *rtphdr;
  bool gotextension_local;
  bool gotmarker_local;
  uint32_t timestamp_local;
  uint16_t seqnr_local;
  size_t payloadlen_local;
  void *payloaddata_local;
  uint8_t payloadtype_local;
  RTPPacket *this_local;
  
  if (numcsrcs < 0x10) {
    if (payloadtype < 0x80) {
      if ((payloadtype == 'H') || (payloadtype == 'I')) {
        this_local._4_4_ = -0x15;
      }
      else {
        this->packetlength = 0xc;
        this->packetlength = (ulong)numcsrcs * 4 + this->packetlength;
        if (gotextension) {
          this->packetlength = this->packetlength + 4;
          this->packetlength = (ulong)extensionlen_numwords * 4 + this->packetlength;
        }
        this->packetlength = payloadlen + this->packetlength;
        if ((maxsize == 0) || (this->packetlength <= maxsize)) {
          if (buffer == (void *)0x0) {
            numbytes = this->packetlength;
            mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            puVar5 = (uint8_t *)operator_new__(numbytes,mgr,8);
            this->packet = puVar5;
            if (this->packet == (uint8_t *)0x0) {
              this->packetlength = 0;
              return -1;
            }
            this->externalbuffer = false;
          }
          else {
            this->packet = (uint8_t *)buffer;
            this->externalbuffer = true;
          }
          this->hasmarker = gotmarker;
          this->hasextension = gotextension;
          this->numcsrcs = (uint)numcsrcs;
          this->payloadtype = payloadtype;
          this->extseqnr = (uint)seqnr;
          this->timestamp = timestamp;
          this->ssrc = ssrc;
          this->payloadlength = payloadlen;
          this->extid = extensionid;
          this->extensionlength = (ulong)extensionlen_numwords << 2;
          puVar1 = (ushort *)this->packet;
          *puVar1 = *puVar1 & 0xff3f | 0x80;
          *puVar1 = *puVar1 & 0xffdf;
          if (gotmarker) {
            *puVar1 = *puVar1 & 0x7fff | 0x8000;
          }
          else {
            *puVar1 = *puVar1 & 0x7fff;
          }
          if (gotextension) {
            *puVar1 = *puVar1 & 0xffef | 0x10;
          }
          else {
            *puVar1 = *puVar1 & 0xffef;
          }
          *puVar1 = *puVar1 & 0xfff0 | numcsrcs & 0xf;
          *puVar1 = *puVar1 & 0x80ff | (ushort)(payloadtype & 0x7f) << 8;
          uVar3 = htons(seqnr);
          puVar1[1] = uVar3;
          uVar4 = htonl(timestamp);
          *(uint32_t *)(puVar1 + 2) = uVar4;
          uVar4 = htonl(ssrc);
          *(uint32_t *)(puVar1 + 4) = uVar4;
          puStack_50 = (uint32_t *)(this->packet + 0xc);
          for (rtpexthdr._4_4_ = 0; rtpexthdr._4_4_ < (int)(uint)numcsrcs;
              rtpexthdr._4_4_ = rtpexthdr._4_4_ + 1) {
            uVar4 = htonl(csrcs[rtpexthdr._4_4_]);
            *puStack_50 = uVar4;
            puStack_50 = puStack_50 + 1;
          }
          this->payload = this->packet + (ulong)numcsrcs * 4 + 0xc;
          if (gotextension) {
            puVar2 = (uint16_t *)this->payload;
            uVar3 = htons(extensionid);
            *puVar2 = uVar3;
            uVar3 = htons(extensionlen_numwords);
            puVar2[1] = uVar3;
            this->payload = this->payload + 4;
            memcpy(this->payload,extensiondata,this->extensionlength);
            this->payload = this->payload + this->extensionlength;
          }
          memcpy(this->payload,payloaddata,payloadlen);
          this_local._4_4_ = 0;
        }
        else {
          this->packetlength = 0;
          this_local._4_4_ = -0x16;
        }
      }
    }
    else {
      this_local._4_4_ = -0x15;
    }
  }
  else {
    this_local._4_4_ = -0x1a;
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacket::BuildPacket(uint8_t payloadtype,const void *payloaddata,size_t payloadlen,uint16_t seqnr,
		  uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,const uint32_t *csrcs,
		  bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,const void *extensiondata,
		  void *buffer,size_t maxsize)
{
	if (numcsrcs > RTP_MAXCSRCS)
		return ERR_RTP_PACKET_TOOMANYCSRCS;

	if (payloadtype > 127) // high bit should not be used
		return ERR_RTP_PACKET_BADPAYLOADTYPE;
	if (payloadtype == 72 || payloadtype == 73) // could cause confusion with rtcp types
		return ERR_RTP_PACKET_BADPAYLOADTYPE;
	
	packetlength = sizeof(RTPHeader);
	packetlength += sizeof(uint32_t)*((size_t)numcsrcs);
	if (gotextension)
	{
		packetlength += sizeof(RTPExtensionHeader);
		packetlength += sizeof(uint32_t)*((size_t)extensionlen_numwords);
	}
	packetlength += payloadlen;

	if (maxsize > 0 && packetlength > maxsize)
	{
		packetlength = 0;
		return ERR_RTP_PACKET_DATAEXCEEDSMAXSIZE;
	}

	// Ok, now we'll just fill in...
	
	RTPHeader *rtphdr;
	
	if (buffer == 0)
	{
		packet = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKET) uint8_t [packetlength];
		if (packet == 0)
		{
			packetlength = 0;
			return ERR_RTP_OUTOFMEM;
		}
		externalbuffer = false;
	}
	else
	{
		packet = (uint8_t *)buffer;
		externalbuffer = true;
	}
	
	RTPPacket::hasmarker = gotmarker;
	RTPPacket::hasextension = gotextension;
	RTPPacket::numcsrcs = numcsrcs;
	RTPPacket::payloadtype = payloadtype;
	RTPPacket::extseqnr = (uint32_t)seqnr;
	RTPPacket::timestamp = timestamp;
	RTPPacket::ssrc = ssrc;
	RTPPacket::payloadlength = payloadlen;
	RTPPacket::extid = extensionid;
	RTPPacket::extensionlength = ((size_t)extensionlen_numwords)*sizeof(uint32_t);
	
	rtphdr = (RTPHeader *)packet;
	rtphdr->version = RTP_VERSION;
	rtphdr->padding = 0;
	if (gotmarker)
		rtphdr->marker = 1;
	else
		rtphdr->marker = 0;
	if (gotextension)
		rtphdr->extension = 1;
	else
		rtphdr->extension = 0;
	rtphdr->csrccount = numcsrcs;
	rtphdr->payloadtype = payloadtype&127; // make sure high bit isn't set
	rtphdr->sequencenumber = htons(seqnr);
	rtphdr->timestamp = htonl(timestamp);
	rtphdr->ssrc = htonl(ssrc);
	
	uint32_t *curcsrc;
	int i;

	curcsrc = (uint32_t *)(packet+sizeof(RTPHeader));
	for (i = 0 ; i < numcsrcs ; i++,curcsrc++)
		*curcsrc = htonl(csrcs[i]);

	payload = packet+sizeof(RTPHeader)+((size_t)numcsrcs)*sizeof(uint32_t); 
	if (gotextension)
	{
		RTPExtensionHeader *rtpexthdr = (RTPExtensionHeader *)payload;

		rtpexthdr->extid = htons(extensionid);
		rtpexthdr->length = htons((uint16_t)extensionlen_numwords);
		
		payload += sizeof(RTPExtensionHeader);
		memcpy(payload,extensiondata,RTPPacket::extensionlength);
		
		payload += RTPPacket::extensionlength;
	}
	memcpy(payload,payloaddata,payloadlen);
	return 0;
}